

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall gpu::Context::Data::Data(Data *this)

{
  (this->ocl_engine).super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ocl_engine).super___shared_ptr<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->cuda_stream = (cudaStream_t)0x0;
  this->ocl_device = (_cl_device_id *)0x0;
  this->type = TypeUndefined;
  this->cuda_device = 0;
  this->cuda_context = (cudaContext_t)0x0;
  this->activated = false;
  return;
}

Assistant:

Context::Data::Data()
{
	type			= TypeUndefined;
	cuda_device		= 0;
	cuda_context	= 0;
	cuda_stream		= 0;
	ocl_device		= 0;
	activated		= false;
}